

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

ON_Line * __thiscall
ON_MeshTopology::TopEdgeLine(ON_Line *__return_storage_ptr__,ON_MeshTopology *this,int tope_index)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ON_Mesh *mesh;
  ON_MeshTopologyEdge *pOVar6;
  ON_MeshTopologyVertex *pOVar7;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  long lVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ON_3dPointListRef vertex_list;
  ON_3dPointListRef local_38;
  
  from_pt.y = ON_3dPoint::UnsetPoint.y;
  from_pt.x = ON_3dPoint::UnsetPoint.x;
  from_pt.z = ON_3dPoint::UnsetPoint.z;
  to_pt.y = ON_3dPoint::UnsetPoint.y;
  to_pt.x = ON_3dPoint::UnsetPoint.x;
  to_pt.z = ON_3dPoint::UnsetPoint.z;
  ON_Line::ON_Line(__return_storage_ptr__,from_pt,to_pt);
  if (((-1 < tope_index) && (mesh = this->m_mesh, mesh != (ON_Mesh *)0x0)) &&
     (tope_index < (this->m_tope).m_count)) {
    pOVar6 = (this->m_tope).m_a;
    iVar2 = pOVar6[(uint)tope_index].m_topvi[0];
    lVar8 = (long)iVar2;
    if ((-1 < lVar8) && (iVar3 = (this->m_topv).m_count, iVar2 < iVar3)) {
      uVar4 = pOVar6[(uint)tope_index].m_topvi[1];
      if ((int)uVar4 < iVar3 && -1 < (int)uVar4) {
        pOVar7 = (this->m_topv).m_a;
        if (((0 < pOVar7[lVar8].m_v_count) && ((uint *)pOVar7[lVar8].m_vi != (uint *)0x0)) &&
           ((0 < pOVar7[uVar4].m_v_count &&
            (((((uint *)pOVar7[uVar4].m_vi != (uint *)0x0 &&
               (uVar5 = *pOVar7[lVar8].m_vi, -1 < (int)uVar5)) &&
              (iVar2 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, (int)uVar5 < iVar2)) &&
             ((uVar4 = *pOVar7[uVar4].m_vi, -1 < (int)uVar4 && ((int)uVar4 < iVar2)))))))) {
          ON_3dPointListRef::ON_3dPointListRef(&local_38,mesh);
          dVar1 = -1.23432101234321e+308;
          dVar10 = -1.23432101234321e+308;
          dVar11 = -1.23432101234321e+308;
          dVar12 = -1.23432101234321e+308;
          if (uVar5 < local_38.m_point_count) {
            if (local_38.m_dP == (double *)0x0) {
              uVar9 = (ulong)(uVar5 * local_38.m_point_stride);
              dVar10 = (double)local_38.m_fP[uVar9];
              dVar11 = (double)local_38.m_fP[uVar9 + 1];
              dVar12 = (double)local_38.m_fP[uVar9 + 2];
            }
            else {
              uVar9 = (ulong)(uVar5 * local_38.m_point_stride);
              dVar10 = local_38.m_dP[uVar9];
              dVar11 = local_38.m_dP[uVar9 + 1];
              dVar12 = local_38.m_dP[uVar9 + 2];
            }
          }
          (__return_storage_ptr__->from).x = dVar10;
          (__return_storage_ptr__->from).y = dVar11;
          (__return_storage_ptr__->from).z = dVar12;
          dVar10 = -1.23432101234321e+308;
          dVar11 = -1.23432101234321e+308;
          if (uVar4 < local_38.m_point_count) {
            if (local_38.m_dP == (double *)0x0) {
              uVar9 = (ulong)(uVar4 * local_38.m_point_stride);
              dVar1 = (double)local_38.m_fP[uVar9];
              dVar10 = (double)local_38.m_fP[uVar9 + 1];
              dVar11 = (double)local_38.m_fP[uVar9 + 2];
            }
            else {
              uVar9 = (ulong)(uVar4 * local_38.m_point_stride);
              dVar1 = local_38.m_dP[uVar9];
              dVar10 = local_38.m_dP[uVar9 + 1];
              dVar11 = local_38.m_dP[uVar9 + 2];
            }
          }
          (__return_storage_ptr__->to).x = dVar1;
          (__return_storage_ptr__->to).y = dVar10;
          (__return_storage_ptr__->to).z = dVar11;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ON_Line ON_MeshTopology::TopEdgeLine( int tope_index ) const
{
  ON_Line L(ON_3dPoint::UnsetPoint,ON_3dPoint::UnsetPoint);
  if ( m_mesh && tope_index >= 0 && tope_index < m_tope.Count() )
  {
    const int* topvi = m_tope[tope_index].m_topvi;
    if (   topvi[0] >= 0 && topvi[0] < m_topv.Count() 
        && topvi[1] >= 0 && topvi[1] < m_topv.Count() )
    {
      const ON_MeshTopologyVertex& v0 = m_topv[topvi[0]];
      const ON_MeshTopologyVertex& v1 = m_topv[topvi[1]];
      if ( v0.m_v_count > 0 && v0.m_vi && v1.m_v_count > 0 && v1.m_vi )
      {
        int vi0 = v0.m_vi[0];
        int vi1 = v1.m_vi[0];
        int vcount = m_mesh->m_V.Count();
        if ( vi0 >= 0 && vi0 < vcount && vi1 >= 0 && vi1 < vcount )
        {
          const ON_3dPointListRef vertex_list(m_mesh);
          L.from = vertex_list[vi0];
          L.to   = vertex_list[vi1];
        }
      }
    }
  }
  return L;
}